

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O2

yajl_gen_status yajl_gen_null(yajl_gen g)

{
  yajl_print_t p_Var1;
  void *pvVar2;
  yajl_gen_state yVar3;
  ulong uVar4;
  size_t sVar5;
  uint _i;
  uint uVar6;
  char *pcVar7;
  
  switch(g->state[g->depth]) {
  case yajl_gen_map_start:
  case yajl_gen_map_key:
    return yajl_gen_keys_must_be_strings;
  case yajl_gen_map_val:
    (*g->print)(g->ctx,":",1);
    if ((g->flags & 1) == 0) goto switchD_00105088_caseD_4;
    pcVar7 = " ";
    break;
  default:
    goto switchD_00105088_caseD_4;
  case yajl_gen_in_array:
    (*g->print)(g->ctx,",",1);
    if ((g->flags & 1) == 0) goto switchD_00105088_caseD_4;
    pcVar7 = "\n";
    break;
  case yajl_gen_complete:
    return yajl_gen_generation_complete;
  case yajl_gen_error:
    return yajl_gen_in_error_state;
  }
  (*g->print)(g->ctx,pcVar7,1);
switchD_00105088_caseD_4:
  if (((g->flags & 1) != 0) && (uVar4 = (ulong)g->depth, g->state[uVar4] != yajl_gen_map_val)) {
    for (uVar6 = 0; uVar6 < (uint)uVar4; uVar6 = uVar6 + 1) {
      p_Var1 = g->print;
      pvVar2 = g->ctx;
      pcVar7 = g->indentString;
      sVar5 = strlen(pcVar7);
      (*p_Var1)(pvVar2,pcVar7,sVar5 & 0xffffffff);
      uVar4 = (ulong)g->depth;
    }
  }
  (*g->print)(g->ctx,"null",4);
  yVar3 = g->state[g->depth];
  if ((ulong)yVar3 < 5) {
    yVar3 = *(yajl_gen_state *)(&DAT_00107848 + (ulong)yVar3 * 4);
    g->state[g->depth] = yVar3;
  }
  if (((g->flags & 1) != 0) && (yVar3 == yajl_gen_complete)) {
    (*g->print)(g->ctx,"\n",1);
  }
  return yajl_gen_status_ok;
}

Assistant:

yajl_gen_status
yajl_gen_null(yajl_gen g)
{
    ENSURE_VALID_STATE; ENSURE_NOT_KEY; INSERT_SEP; INSERT_WHITESPACE;
    g->print(g->ctx, "null", strlen("null"));
    APPENDED_ATOM;
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}